

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reductions.cpp
# Opt level: O2

void __thiscall MxxReduce_MinMaxLoc_Test::TestBody(MxxReduce_MinMaxLoc_Test *this)

{
  pair<int,_int> *this_00;
  char *pcVar1;
  pair<double,_int> pVar2;
  pair<int,_int> local_70;
  pair<int,_int> minloc;
  AssertHelper local_60;
  AssertionResult gtest_ar;
  comm c;
  double local_18;
  int local_10 [2];
  
  mxx::comm::comm(&c);
  gtest_ar._0_8_ = (double)c.m_rank * 3.1;
  pVar2 = mxx::max_element<double>((double *)&gtest_ar,&c);
  local_18 = pVar2.first;
  local_10[0] = pVar2.second;
  minloc.first = c.m_size + -1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"c.size()-1","maxloc.second",&minloc.first,local_10);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&minloc);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x133,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&minloc);
LAB_0015bc91:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    this_00 = &minloc;
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    minloc = (pair<int,_int>)((double)(c.m_size + -1) * 3.1);
    testing::internal::CmpHelperEQ<double,double>
              ((internal *)&gtest_ar,"3.1*(c.size()-1)","maxloc.first",(double *)&minloc,&local_18);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&minloc);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_70,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
                 ,0x134,pcVar1);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)&minloc);
      goto LAB_0015bc91;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_70.first = c.m_rank + 0xd;
    mxx::comm::comm((comm *)&gtest_ar);
    minloc = mxx::min_element<int>(&local_70.first,(comm *)&gtest_ar);
    mxx::comm::~comm((comm *)&gtest_ar);
    local_70.first = 0xd;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"13","minloc.first",&local_70.first,&minloc.first);
    if (gtest_ar.success_ != false) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_70.first = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&gtest_ar,"0","minloc.second",&local_70.first,&minloc.second);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_70);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
                   ,0x138,pcVar1);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_70);
      }
      goto LAB_0015bcad;
    }
    testing::Message::Message((Message *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_reductions.cpp"
               ,0x137,pcVar1);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    this_00 = &local_70;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_00);
LAB_0015bcad:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mxx::comm::~comm(&c);
  return;
}

Assistant:

TEST(MxxReduce, MinMaxLoc) {
    mxx::comm c;

    std::pair<double, int> maxloc = mxx::max_element(3.1*c.rank(), c);
    ASSERT_EQ(c.size()-1, maxloc.second);
    ASSERT_EQ(3.1*(c.size()-1), maxloc.first);

    std::pair<int, int> minloc = mxx::min_element(c.rank()+13);
    ASSERT_EQ(13, minloc.first);
    ASSERT_EQ(0, minloc.second);
}